

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

void FT_CMap_Done(FT_CMap_conflict cmap)

{
  int iVar1;
  FT_Face pFVar2;
  FT_CharMap pFVar3;
  FT_Memory pFVar4;
  FT_CMap_DoneFunc p_Var5;
  FT_CharMap *ppFVar6;
  ulong uVar7;
  FT_CharMap pFVar8;
  ulong uVar9;
  FT_Error error;
  int local_2c;
  
  if (cmap != (FT_CMap_conflict)0x0) {
    pFVar2 = (cmap->charmap).face;
    uVar7 = (ulong)pFVar2->num_charmaps;
    if (0 < (long)uVar7) {
      ppFVar6 = pFVar2->charmaps;
      uVar9 = 0;
      do {
        if ((FT_CMap_conflict)ppFVar6[uVar9] == cmap) {
          pFVar3 = ppFVar6[uVar7 - 1];
          ppFVar6 = (FT_CharMap *)
                    ft_mem_qrealloc(pFVar2->memory,8,uVar7,uVar7 - 1,ppFVar6,&local_2c);
          pFVar2->charmaps = ppFVar6;
          if (local_2c != 0) {
            return;
          }
          iVar1 = pFVar2->num_charmaps;
          if ((int)uVar9 + 1 < iVar1) {
            do {
              uVar7 = (ulong)(iVar1 - 2);
              pFVar8 = pFVar3;
              if (iVar1 - 2 != uVar9) {
                pFVar8 = pFVar2->charmaps[uVar9 + 1];
                uVar7 = uVar9;
              }
              pFVar2->charmaps[uVar7] = pFVar8;
              uVar9 = uVar9 + 1;
            } while (iVar1 - 1 != uVar9);
          }
          pFVar2->num_charmaps = iVar1 + -1;
          if ((FT_CMap_conflict)pFVar2->charmap == cmap) {
            pFVar2->charmap = (FT_CharMap)0x0;
          }
          pFVar4 = ((cmap->charmap).face)->memory;
          p_Var5 = cmap->clazz->done;
          if (p_Var5 != (FT_CMap_DoneFunc)0x0) {
            (*p_Var5)(cmap);
          }
          (*pFVar4->free)(pFVar4,cmap);
          return;
        }
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_CMap_Done( FT_CMap  cmap )
  {
    if ( cmap )
    {
      FT_Face    face   = cmap->charmap.face;
      FT_Memory  memory = FT_FACE_MEMORY( face );
      FT_Error   error;
      FT_Int     i, j;


      for ( i = 0; i < face->num_charmaps; i++ )
      {
        if ( (FT_CMap)face->charmaps[i] == cmap )
        {
          FT_CharMap  last_charmap = face->charmaps[face->num_charmaps - 1];


          if ( FT_QRENEW_ARRAY( face->charmaps,
                                face->num_charmaps,
                                face->num_charmaps - 1 ) )
            return;

          /* remove it from our list of charmaps */
          for ( j = i + 1; j < face->num_charmaps; j++ )
          {
            if ( j == face->num_charmaps - 1 )
              face->charmaps[j - 1] = last_charmap;
            else
              face->charmaps[j - 1] = face->charmaps[j];
          }

          face->num_charmaps--;

          if ( (FT_CMap)face->charmap == cmap )
            face->charmap = NULL;

          ft_cmap_done_internal( cmap );

          break;
        }
      }
    }
  }